

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector3f __thiscall pbrt::Frame::FromLocal(Frame *this,Vector3f v)

{
  undefined1 auVar1 [16];
  undefined8 in_XMM0_Qb;
  Vector3<float> VVar2;
  Vector3<float> VVar3;
  Vector3<float> VVar4;
  Vector3f VVar5;
  float local_28;
  float fStack_24;
  float local_18;
  float fStack_14;
  
  VVar2 = Tuple3<pbrt::Vector3,float>::operator*
                    ((Tuple3<pbrt::Vector3,float> *)this,v.super_Tuple3<pbrt::Vector3,_float>.x);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar1 = vmovshdup_avx(auVar1);
  VVar3 = Tuple3<pbrt::Vector3,float>::operator*
                    ((Tuple3<pbrt::Vector3,float> *)&this->y,auVar1._0_4_);
  local_28 = VVar3.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_24 = VVar3.super_Tuple3<pbrt::Vector3,_float>.y;
  VVar4 = Tuple3<pbrt::Vector3,float>::operator*
                    ((Tuple3<pbrt::Vector3,float> *)&this->z,v.super_Tuple3<pbrt::Vector3,_float>.z)
  ;
  local_18 = VVar2.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_14 = VVar2.super_Tuple3<pbrt::Vector3,_float>.y;
  VVar5.super_Tuple3<pbrt::Vector3,_float>.x =
       local_28 + local_18 + VVar4.super_Tuple3<pbrt::Vector3,_float>.x;
  VVar5.super_Tuple3<pbrt::Vector3,_float>.y =
       fStack_24 + fStack_14 + VVar4.super_Tuple3<pbrt::Vector3,_float>.y;
  VVar5.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar4.super_Tuple3<pbrt::Vector3,_float>.z +
       VVar3.super_Tuple3<pbrt::Vector3,_float>.z + VVar2.super_Tuple3<pbrt::Vector3,_float>.z;
  return (Vector3f)VVar5.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Vector3f FromLocal(Vector3f v) const { return v.x * x + v.y * y + v.z * z; }